

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O2

QVariant * __thiscall
QSqlRelationalTableModel::data
          (QVariant *__return_storage_ptr__,QSqlRelationalTableModel *this,QModelIndex *index,
          int role)

{
  long lVar1;
  QRelation *this_00;
  Data *dd;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  QVariant *pQVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  int local_7c;
  undefined1 *local_78;
  QSqlRecord QStack_70;
  QSqlRecord local_68;
  undefined1 *puStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((role == 0) && (uVar3 = (ulong)index->c, -1 < (long)uVar3)) &&
     (lVar1 = *(long *)(this + 8), uVar3 < *(ulong *)(lVar1 + 0x2f8))) {
    bVar2 = QRelation::isValid(*(QRelation **)(*(long *)(lVar1 + 0x2f0) + uVar3 * 0x10));
    if (bVar2) {
      lVar4 = (long)index->c * 0x10;
      this_00 = *(QRelation **)(*(long *)(lVar1 + 0x2f0) + lVar4);
      dd = *(Data **)(*(long *)(lVar1 + 0x2f0) + 8 + lVar4);
      if (dd != (Data *)0x0) {
        LOCK();
        (dd->weakref)._q_value.super___atomic_base<int>._M_i =
             (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (dd->strongref)._q_value.super___atomic_base<int>._M_i =
             (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (this_00->m_dictInitialized == false) {
        QRelation::populateDictionary(this_00);
      }
      if (*(int *)(lVar1 + 0x238) != 0) {
        local_68.d.d.ptr = (QExplicitlySharedDataPointer<QSqlRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        QStack_70.d.d.ptr = (QExplicitlySharedDataPointer<QSqlRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        local_7c = index->r;
        QSqlRecord::QSqlRecord((QSqlRecord *)&local_98);
        QSqlTableModelPrivate::ModifiedRow::ModifiedRow
                  ((ModifiedRow *)&local_58,None,(QSqlRecord *)&local_98);
        QMap<int,_QSqlTableModelPrivate::ModifiedRow>::value
                  ((ModifiedRow *)&local_78,
                   (QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar1 + 0x2e0),&local_7c,
                   (ModifiedRow *)&local_58);
        QSqlTableModelPrivate::ModifiedRow::~ModifiedRow((ModifiedRow *)&local_58);
        QSqlRecord::~QSqlRecord((QSqlRecord *)&local_98);
        if ((Op)local_78 != None) {
          bVar2 = QSqlRecord::isGenerated(&QStack_70,index->c);
          if ((bVar2) && ((*(int *)(lVar1 + 0x238) == 2 || ((Op)local_78 != Delete)))) {
            local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
            local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
            local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QSqlRecord::value((QVariant *)&local_58,&QStack_70,index->c);
            if ((undefined1 *)0x3 < puStack_40) {
              QVariant::toString();
              pQVar5 = QHash<QString,_QVariant>::operator[]
                                 (&this_00->dictionary,(QString *)&local_98);
              QVariant::QVariant(__return_storage_ptr__,pQVar5);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
              QVariant::~QVariant((QVariant *)&local_58);
              QSqlTableModelPrivate::ModifiedRow::~ModifiedRow((ModifiedRow *)&local_78);
              QSharedPointer<QRelation>::deref(dd);
              goto LAB_0012e46b;
            }
            QVariant::~QVariant((QVariant *)&local_58);
          }
        }
        QSqlTableModelPrivate::ModifiedRow::~ModifiedRow((ModifiedRow *)&local_78);
      }
      QSharedPointer<QRelation>::deref(dd);
    }
  }
  QSqlTableModel::data(__return_storage_ptr__,(QSqlTableModel *)this,index,role);
LAB_0012e46b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSqlRelationalTableModel::data(const QModelIndex &index, int role) const
{
    Q_D(const QSqlRelationalTableModel);

    if (role == Qt::DisplayRole && index.column() >= 0 && index.column() < d->relations.size() &&
            d->relations.at(index.column())->isValid()) {
        auto relation = d->relations.at(index.column());
        if (!relation->isDictionaryInitialized())
            relation->populateDictionary();

        //only perform a dictionary lookup for the display value
        //when the value at index has been changed or added.
        //At an unmodified index, the underlying model will
        //already have the correct display value.
        if (d->strategy != OnFieldChange) {
            const QSqlTableModelPrivate::ModifiedRow row = d->cache.value(index.row());
            if (row.op() != QSqlTableModelPrivate::None && row.rec().isGenerated(index.column())) {
                if (d->strategy == OnManualSubmit || row.op() != QSqlTableModelPrivate::Delete) {
                    QVariant v = row.rec().value(index.column());
                    if (v.isValid())
                        return relation->dictionary[v.toString()];
                }
            }
        }
    }
    return QSqlTableModel::data(index, role);
}